

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

boolean lava_effects(void)

{
  obj *poVar1;
  boolean bVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  int tmp;
  int n;
  uint uVar7;
  int iVar8;
  obj *poVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  
  burn_away_slime();
  if (youmonst.data == mons + 0x157 || youmonst.data == mons + 0xa0) {
    return '\0';
  }
  if (((u.uprops[1].intrinsic != 0 || u.uprops[1].extrinsic != 0) &&
      (((u.uprops[1].intrinsic >> 0x1a & 1) == 0 ||
       ((u.uprops[1].intrinsic & 0xfbffffff) != 0 || u.uprops[1].extrinsic != 0)))) ||
     (((byte)youmonst.mintrinsics & 1) != 0)) goto LAB_0026b9a9;
  if ((u.uprops[0x27].extrinsic == 0) ||
     (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) {
    if (((u.uprops[1].intrinsic >> 0x1a & 1) == 0) ||
       (((u.uprops[1].intrinsic & 0xfbffffff) != 0 || u.uprops[1].extrinsic != 0 ||
        (uVar4 = 0, ((byte)youmonst.mintrinsics & 1) != 0)))) {
      pline("You fall into the lava!");
      goto LAB_0026b5fa;
    }
LAB_0026b940:
    uVar7 = 6;
    if ((uVar4 & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0) {
      uVar7 = ((byte)youmonst.mintrinsics & 1) * 3 + 3;
    }
  }
  else {
    uVar7 = 6;
    uVar4 = u.uprops[1].intrinsic;
    if ((u.uprops[1].intrinsic >> 0x1a & 1) != 0) goto LAB_0026b940;
  }
  n = 6;
  iVar8 = -6;
  do {
    uVar4 = mt_random();
    n = n + uVar4 % uVar7;
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0);
  pline("The lava here burns you!");
  if (u.uhp <= n) {
LAB_0026b5fa:
    bVar10 = u.uprops[0x2b].extrinsic != 0;
    bVar11 = flags.explore == '\0';
    bVar12 = flags.debug != '\0';
    if (invent != (obj *)0x0) {
      poVar9 = invent;
      do {
        poVar1 = poVar9->nobj;
        if (((*(ushort *)&objects[poVar9->otyp].field_0x11 & 0x1f0) < 0x90) &&
           ((poVar9->field_0x4b & 0x10) == 0)) {
          if (poVar9->otyp == 0x1bd) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0026b6a3;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0026b69a;
              if ((!bVar12 && !bVar10) && bVar11) goto LAB_0026b86b;
LAB_0026b6b2:
              pcVar5 = xname(poVar9);
              pcVar5 = The(pcVar5);
              pcVar6 = hcolor("dark red");
              pline("%s glows a strange %s, but remains intact.",pcVar5,pcVar6);
            }
            else {
LAB_0026b69a:
              if (ublindf != (obj *)0x0) {
LAB_0026b6a3:
                if (ublindf->oartifact == '\x1d' && ((bVar12 || bVar10) || !bVar11))
                goto LAB_0026b6b2;
              }
            }
          }
          else {
            if (poVar9->owornmask != 0) {
              if ((bVar12 || bVar10) || !bVar11) {
                aobjnam(poVar9,"burst");
                pline("Your %s into flame!");
              }
              if (poVar9 == uarm) {
                Armor_gone((!bVar12 && !bVar10) && bVar11);
              }
              else if (poVar9 == uarmc) {
                Cloak_off();
              }
              else if (poVar9 == uarmh) {
                Helmet_off();
              }
              else if (poVar9 == uarms) {
                Shield_off();
              }
              else if (poVar9 == uarmg) {
                Gloves_off();
              }
              else if (poVar9 == uarmf) {
                Boots_off();
              }
              else if (poVar9 == uarmu) {
                Shirt_off();
              }
              else if ((poVar9 == uleft) || (poVar9 == uright)) {
                Ring_gone(poVar9);
              }
              else if (poVar9 == ublindf) {
                Blindf_off(poVar9,'\0');
              }
              else if (poVar9 == uamul) {
                Amulet_off();
              }
              else if (poVar9 == uwep) {
                uwepgone();
              }
              else if (poVar9 == uquiver) {
                uqwepgone();
              }
              else if (poVar9 == uswapwep) {
                uswapwepgone();
              }
            }
            useupall(poVar9);
          }
        }
LAB_0026b86b:
        poVar9 = poVar1;
      } while (poVar1 != (obj *)0x0);
    }
    u.uhp = -1;
    killer_format = 1;
    killer = "molten lava";
    pline("You burn to a crisp...");
    done(5);
    cVar3 = safe_teleds('\x01');
    while (cVar3 == '\0') {
      pline("You\'re still burning.");
      done(5);
      cVar3 = safe_teleds('\x01');
    }
    pcVar5 = surface((int)u.ux,(int)u.uy);
    pline("You find yourself back on solid %s.",pcVar5);
    return '\x01';
  }
  losehp(n,"molten lava",1);
LAB_0026b9a9:
  if ((u.uprops[0x27].extrinsic == 0) ||
     (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 != '\0')) {
    uVar4 = mt_random();
    uVar7 = mt_random();
    u.utrap = (uVar7 & 3) * 0x100 + (uVar4 & 3) + 0xc04;
    u.utraptype = 3;
    if (((u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) ||
        ((pcVar5 = ", but it only burns slightly", (u.uprops[1].intrinsic >> 0x1a & 1) != 0 &&
         ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)))) &&
       (pcVar5 = ", but it only burns slightly", ((byte)youmonst.mintrinsics & 1) == 0)) {
      pcVar5 = "";
    }
    pline("You sink into the lava%s!",pcVar5);
    if (1 < u.uhp) {
      losehp(1,"molten lava",1);
    }
  }
  poVar9 = uarmf;
  if (((uarmf != (obj *)0x0) && ((uarmf->field_0x4b & 0x10) == 0)) &&
     ((*(ushort *)&objects[uarmf->otyp].field_0x11 & 0x1f0) < 0x90)) {
    pcVar5 = xname(uarmf);
    pline("Your %s bursts into flame!",pcVar5);
    Boots_off();
    useup(poVar9);
  }
  destroy_item(9,2);
  destroy_item(10,2);
  destroy_item(8,2);
  return '\0';
}

Assistant:

boolean lava_effects(void)
{
    struct obj *obj, *obj2;
    int dmg;
    boolean usurvive;

    burn_away_slime();
    if (likes_lava(youmonst.data)) return FALSE;

    if (!FFire_resistance) {
	if (Wwalking || PFire_resistance) {
	    dmg = dice(6, PFire_resistance ? 3 : 6);
	    pline("The lava here burns you!");
	    if (dmg < u.uhp) {
		losehp(dmg, lava_killer, KILLED_BY);
		goto sink_in;
	    }
	} else {
	    pline("You fall into the lava!");
	}

	usurvive = Lifesaved || discover;
	if (wizard)
		usurvive = TRUE;
	
	for (obj = invent; obj; obj = obj2) {
	    obj2 = obj->nobj;
	    if (is_organic(obj) && !obj->oerodeproof) {
		/* Prevent the Book of the Dead from being destroyed when
		 * the player falls into lava. */
		if (obj->otyp == SPE_BOOK_OF_THE_DEAD) {
		    if (!Blind && usurvive) {
			pline("%s glows a strange %s, but remains intact.",
			      The(xname(obj)), hcolor("dark red"));
		    }
		    continue;
		}
		if (obj->owornmask) {
		    if (usurvive)
			pline("Your %s into flame!", aobjnam(obj, "burst"));

		    if (obj == uarm) Armor_gone(!usurvive);
		    else if (obj == uarmc) Cloak_off();
		    else if (obj == uarmh) Helmet_off();
		    else if (obj == uarms) Shield_off();
		    else if (obj == uarmg) Gloves_off();
		    else if (obj == uarmf) Boots_off();
		    else if (obj == uarmu) Shirt_off();
		    else if (obj == uleft) Ring_gone(obj);
		    else if (obj == uright) Ring_gone(obj);
		    else if (obj == ublindf) Blindf_off(obj, FALSE);
		    else if (obj == uamul) Amulet_off();
		    else if (obj == uwep) uwepgone();
		    else if (obj == uquiver) uqwepgone();
		    else if (obj == uswapwep) uswapwepgone();
		}
		useupall(obj);
	    }
	}

	/* s/he died... */
	u.uhp = -1;
	killer_format = KILLED_BY;
	killer = lava_killer;
	pline("You burn to a crisp...");
	done(BURNING);
	while (!safe_teleds(TRUE)) {
		pline("You're still burning.");
		done(BURNING);
	}
	pline("You find yourself back on solid %s.", surface(u.ux, u.uy));
	return TRUE;
    }

 sink_in:
    if (!Wwalking) {
	u.utrap = rn1(4, 4) + (rn1(4, 12) << 8);
	u.utraptype = TT_LAVA;
	pline("You sink into the lava%s!",
	      FFire_resistance ? ", but it only burns slightly" : "");
	if (u.uhp > 1)
	    losehp(1, lava_killer, KILLED_BY);
    }
    /* just want to burn boots, not all armor; destroy_item doesn't work on
       armor anyway */
    if (uarmf && !uarmf->oerodeproof && is_organic(uarmf)) {
	/* save uarmf value because Boots_off() sets uarmf to null */
	obj = uarmf;
	pline("Your %s bursts into flame!", xname(obj));
	Boots_off();
	useup(obj);
    }
    destroy_item(SCROLL_CLASS, AD_FIRE);
    destroy_item(SPBOOK_CLASS, AD_FIRE);
    destroy_item(POTION_CLASS, AD_FIRE);
    return FALSE;
}